

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

void __thiscall soul::Value::PackedData::negateAs<std::complex<double>>(PackedData *this)

{
  uint8_t *puVar1;
  undefined4 extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  
  getAs<std::complex<double>>(this);
  if (this->size == 0x10) {
    puVar1 = this->data;
    *(undefined4 *)puVar1 = extraout_XMM0_Da;
    *(uint *)(puVar1 + 4) = extraout_XMM0_Db ^ 0x80000000;
    *(int *)(puVar1 + 8) = (int)in_XMM1_Qa;
    *(uint *)(puVar1 + 0xc) = (uint)((ulong)in_XMM1_Qa >> 0x20) ^ 0x80000000;
    return;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","setAs",0x161);
}

Assistant:

void negateAs() const                   { setAs (-getAs<Primitive>()); }